

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::checkbox::render_value(checkbox *this,form_context *context)

{
  uint32_t uVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_40;
  
  if ((this->super_base_html_input).field_0x58 == '\x01') {
    uVar1 = context->html_type_;
    poVar2 = form_context::out(context);
    pcVar3 = " checked ";
    if (uVar1 == 1) {
      pcVar3 = " checked=\"checked\" ";
    }
    std::operator<<(poVar2,pcVar3);
  }
  poVar2 = form_context::out(context);
  poVar2 = std::operator<<(poVar2,"value=\"");
  util::escape(&local_40,(string *)&(this->super_base_html_input).field_0x38);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  std::operator<<(poVar2,"\" ");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void checkbox::render_value(form_context &context)
{
	if(value()) {
		if(context.html() == as_xhtml)
			context.out() << " checked=\"checked\" ";
		else
			context.out() << " checked ";
	}
	context.out() << "value=\""<<util::escape(identification_)<<"\" ";
}